

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void predict(log_multi *b,single_learner *base,example *ec)

{
  undefined8 uVar1;
  node *pnVar2;
  size_t in_RDX;
  long in_RDI;
  uint32_t depth;
  uint32_t cn;
  label_t mc;
  size_t i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  
  uVar1 = *(undefined8 *)(in_RDX + 0x6828);
  uVar5 = 0x7f7fffff;
  *(undefined8 *)(in_RDX + 0x6828) = 0x7f7fffff;
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  uVar4 = 0;
  iVar3 = 0;
  while( true ) {
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)uVar4);
    if ((pnVar2->internal & 1U) == 0) break;
    i = in_RDX;
    v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)uVar4);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)CONCAT44(uVar5,uVar4),
               (example *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),i);
    pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)uVar4);
    uVar4 = descend(pnVar2,*(float *)(in_RDX + 0x6850));
    iVar3 = iVar3 + 1;
  }
  pnVar2 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)uVar4);
  *(uint32_t *)(in_RDX + 0x6850) = pnVar2->max_count_label;
  *(undefined8 *)(in_RDX + 0x6828) = uVar1;
  return;
}

Assistant:

void predict(log_multi& b, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  uint32_t cn = 0;
  uint32_t depth = 0;
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_predictor);  // depth
    cn = descend(b.nodes[cn], ec.pred.scalar);
    depth++;
  }
  ec.pred.multiclass = b.nodes[cn].max_count_label;
  ec.l.multi = mc;
}